

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

config * __thiscall mpt::convertable::operator_cast_to_config_(convertable *this)

{
  config *ptr;
  
  (**this->_vptr_convertable)(this,0x85);
  return (config *)0x0;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}